

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

Expression * __thiscall slang::ast::CoverpointSymbol::getIffExpr(CoverpointSymbol *this)

{
  CoverageIffClauseSyntax *pCVar1;
  SyntaxNode *scope_00;
  bool bVar2;
  int iVar3;
  CoverpointSyntax *pCVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  Expression **ppEVar6;
  LookupLocation lookupLocation;
  bitmask<slang::ast::ASTFlags> local_a8;
  Expression *local_a0;
  _Storage<const_slang::ast::Expression_*,_true> local_98;
  undefined8 local_90;
  bitmask<slang::ast::ASTFlags> local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined1 local_70 [8];
  ASTContext context;
  CoverageIffClauseSyntax *iffSyntax;
  SyntaxNode *local_20;
  SyntaxNode *syntax;
  Scope *scope;
  CoverpointSymbol *this_local;
  
  scope = (Scope *)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->iffExpr);
  if (!bVar2) {
    syntax = (SyntaxNode *)Symbol::getParentScope(&this->super_Symbol);
    local_20 = Symbol::getSyntax(&this->super_Symbol);
    if (syntax == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                 ,0x2f0,"const Expression *slang::ast::CoverpointSymbol::getIffExpr() const");
    }
    if (local_20 == (SyntaxNode *)0x0) {
      iffSyntax = (CoverageIffClauseSyntax *)0x0;
      std::optional<slang::ast::Expression_const*>::operator=
                ((optional<slang::ast::Expression_const*> *)&this->iffExpr,&iffSyntax);
    }
    else {
      pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::CoverpointSyntax>(local_20);
      scope_00 = syntax;
      pCVar1 = pCVar4->iff;
      if (pCVar1 == (CoverageIffClauseSyntax *)0x0) {
        context.assertionInstance = (AssertionInstanceDetails *)0x0;
        std::optional<slang::ast::Expression_const*>::operator=
                  ((optional<slang::ast::Expression_const*> *)&this->iffExpr,
                   &context.assertionInstance);
      }
      else {
        local_80 = LookupLocation::min;
        local_78 = (undefined4)DAT_0091b928;
        uStack_74 = (undefined4)((ulong)DAT_0091b928 >> 0x20);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_88,None);
        lookupLocation.index = local_78;
        lookupLocation.scope = (Scope *)local_80;
        lookupLocation._12_4_ = 0;
        ASTContext::ASTContext((ASTContext *)local_70,(Scope *)scope_00,lookupLocation,local_88);
        pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pCVar1->expr);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_a8,AllowCoverageSampleFormal);
        iVar3 = Expression::bind((int)pEVar5,(sockaddr *)local_70,(socklen_t)local_a8.m_bits);
        local_a0 = (Expression *)CONCAT44(extraout_var,iVar3);
        std::optional<const_slang::ast::Expression_*>::
        optional<const_slang::ast::Expression_*,_true>
                  ((optional<const_slang::ast::Expression_*> *)&local_98,&local_a0);
        (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload = local_98;
        *(undefined8 *)
         &(this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged =
             local_90;
        ppEVar6 = std::optional<const_slang::ast::Expression_*>::value(&this->iffExpr);
        ASTContext::requireBooleanConvertible((ASTContext *)local_70,*ppEVar6);
      }
    }
  }
  ppEVar6 = std::optional<const_slang::ast::Expression_*>::operator*(&this->iffExpr);
  return *ppEVar6;
}

Assistant:

const Expression* CoverpointSymbol::getIffExpr() const {
    if (!iffExpr) {
        auto scope = getParentScope();
        auto syntax = getSyntax();
        ASSERT(scope);

        if (!syntax)
            iffExpr = nullptr;
        else {
            auto iffSyntax = syntax->as<CoverpointSyntax>().iff;
            if (!iffSyntax)
                iffExpr = nullptr;
            else {
                ASTContext context(*scope, LookupLocation::min);
                iffExpr = &Expression::bind(*iffSyntax->expr, context,
                                            ASTFlags::AllowCoverageSampleFormal);
                context.requireBooleanConvertible(*iffExpr.value());
            }
        }
    }
    return *iffExpr;
}